

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

SIMDExtractOp __thiscall
wasm::Random::pick<wasm::SIMDExtractOp>(Random *this,FeatureOptions<wasm::SIMDExtractOp> *picker)

{
  SIMDExtractOp SVar1;
  value_type *pvVar2;
  vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_> local_30;
  
  items<wasm::SIMDExtractOp>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::SIMDExtractOp,std::allocator<wasm::SIMDExtractOp>>>
                     (this,&local_30);
  SVar1 = *pvVar2;
  if (local_30.super__Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return SVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }